

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int g_write(lua_State *L,FILE *f,int arg)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *__ptr;
  size_t sVar4;
  long n;
  size_t len;
  char buff [64];
  
  iVar1 = lua_gettop(L);
  piVar3 = __errno_location();
  *piVar3 = 0;
  n = 0;
  while( true ) {
    if (iVar1 == arg) {
      return 1;
    }
    uVar2 = lua_numbertocstring(L,arg,buff);
    len = (size_t)uVar2;
    if (uVar2 == 0) {
      __ptr = luaL_checklstring(L,arg,&len);
    }
    else {
      len = len - 1;
      __ptr = buff;
    }
    sVar4 = fwrite(__ptr,1,len,(FILE *)f);
    n = n + sVar4;
    if (sVar4 < len) break;
    arg = arg + 1;
  }
  iVar1 = luaL_fileresult(L,0,(char *)0x0);
  lua_pushinteger(L,n);
  return iVar1 + 1;
}

Assistant:

static int g_write (lua_State *L, FILE *f, int arg) {
  int nargs = lua_gettop(L) - arg;
  size_t totalbytes = 0;  /* total number of bytes written */
  errno = 0;
  for (; nargs--; arg++) {  /* for each argument */
    char buff[LUA_N2SBUFFSZ];
    const char *s;
    size_t numbytes;  /* bytes written in one call to 'fwrite' */
    size_t len = lua_numbertocstring(L, arg, buff);  /* try as a number */
    if (len > 0) {  /* did conversion work (value was a number)? */
      s = buff;
      len--;
    }
    else  /* must be a string */
      s = luaL_checklstring(L, arg, &len);
    numbytes = fwrite(s, sizeof(char), len, f);
    totalbytes += numbytes;
    if (numbytes < len) {  /* write error? */
      int n = luaL_fileresult(L, 0, NULL);
      lua_pushinteger(L, cast_st2S(totalbytes));
      return n + 1;  /* return fail, error msg., error code, and counter */
    }
  }
  return 1;  /* no errors; file handle already on stack top */
}